

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpg_element_vector_provider.h
# Opt level: O0

ElemVec __thiscall
projects::dpg::DpgElementVectorProvider<double>::Eval
          (DpgElementVectorProvider<double> *this,Entity *cell)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  Index IVar5;
  Index IVar6;
  ostream *poVar7;
  Entity *in_RDX;
  Index extraout_RDX;
  ElemVec EVar8;
  LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_840;
  Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_7f0;
  non_const_type local_7e0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
  local_7d8;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  stringstream local_6d8 [8];
  stringstream ss_2;
  ostream local_6c8 [376];
  undefined1 local_550 [8];
  ElemMat gramian;
  ElemMat extendedStiffnessMatrix;
  ElemVec extendedLoadVector;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  stringstream local_428 [8];
  stringstream ss_1;
  ostream local_418 [383];
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Entity *local_20;
  Entity *cell_local;
  DpgElementVectorProvider<double> *this_local;
  
  local_20 = in_RDX;
  cell_local = cell;
  this_local = this;
  bVar1 = std::operator==((shared_ptr<projects::dpg::ProductElementVectorProvider<double>_> *)
                          (cell + 1),(nullptr_t)0x0);
  if (((((bVar1 ^ 0xffU) & 1) != 0) &&
      (bVar1 = std::operator==((shared_ptr<projects::dpg::ProductElementMatrixProvider<double>_> *)
                               (cell + 3),(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) &&
     (bVar1 = std::operator==((shared_ptr<projects::dpg::ProductElementMatrixProvider<double>_> *)
                              (cell + 5),(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    peVar3 = std::
             __shared_ptr_access<projects::dpg::ProductElementVectorProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<projects::dpg::ProductElementVectorProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(cell + 1));
    uVar2 = (**peVar3->_vptr_ProductElementVectorProvider)(peVar3,local_20);
    if ((uVar2 & 1) != 0) {
      peVar4 = std::
               __shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(cell + 3));
      uVar2 = (**peVar4->_vptr_ProductElementMatrixProvider)(peVar4,local_20);
      if ((uVar2 & 1) != 0) {
        peVar4 = std::
                 __shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(cell + 5));
        uVar2 = (**peVar4->_vptr_ProductElementMatrixProvider)(peVar4,local_20);
        if ((uVar2 & 1) != 0) {
          peVar3 = std::
                   __shared_ptr_access<projects::dpg::ProductElementVectorProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<projects::dpg::ProductElementVectorProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(cell + 1));
          ProductElementVectorProvider<double>::Eval
                    ((ProductElementVectorProvider<double> *)
                     &extendedStiffnessMatrix.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(Entity *)peVar3);
          peVar4 = std::
                   __shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(cell + 3));
          ProductElementMatrixProvider<double>::Eval
                    ((ElemMat *)
                     &gramian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols,peVar4,local_20);
          peVar4 = std::
                   __shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<projects::dpg::ProductElementMatrixProvider<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(cell + 5));
          ProductElementMatrixProvider<double>::Eval((ElemMat *)local_550,peVar4,local_20);
          IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_550
                            );
          IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_550
                            );
          if (IVar5 == IVar6) {
            local_7e0 = (non_const_type)
                        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   &gramian.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols);
            Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::ldlt
                      (&local_840,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_550
                      );
            local_7f0 = Eigen::SolverBase<Eigen::LDLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>>::
                        solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                                  ((SolverBase<Eigen::LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>> *
                                   )&local_840,
                                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   &extendedStiffnessMatrix.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols);
            Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                      (&local_7d8,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                       &local_7e0,
                       (MatrixBase<Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_7f0);
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::Matrix<double,_1,1,0,_1,1>>,0>>
                      ((Matrix<double,_1,1,0,_1,1> *)this,
                       (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Solve<Eigen::LDLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                        *)&local_7d8);
            Eigen::LDLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LDLT(&local_840);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_550);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       &gramian.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols);
            Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                      ((Matrix<double,__1,_1,_0,__1,_1> *)
                       &extendedStiffnessMatrix.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            EVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                 extraout_RDX;
            EVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                 (double *)this;
            return (ElemVec)EVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage;
          }
          std::__cxx11::stringstream::stringstream(local_6d8);
          poVar7 = std::operator<<(local_6c8,"non quadratic gramian of size (");
          IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_550
                            );
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,IVar5);
          poVar7 = std::operator<<(poVar7,", ");
          IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_550
                            );
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,IVar5);
          poVar7 = std::operator<<(poVar7,") on cell ");
          poVar7 = lf::mesh::operator<<(poVar7,local_20);
          std::operator<<(poVar7,"\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"gramian.rows() == gramian.cols()",&local_6f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_720,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
                     ,&local_721);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_6f8,&local_720,0x9a,&local_748);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::string::~string((string *)&local_720);
          std::allocator<char>::~allocator(&local_721);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::allocator<char>::~allocator(&local_6f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_768,"false",&local_769);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_790,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
                     ,&local_791);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"",&local_7b9);
          lf::base::AssertionFailed(&local_768,&local_790,0x9a,&local_7b8);
          std::__cxx11::string::~string((string *)&local_7b8);
          std::allocator<char>::~allocator(&local_7b9);
          std::__cxx11::string::~string((string *)&local_790);
          std::allocator<char>::~allocator(&local_791);
          std::__cxx11::string::~string((string *)&local_768);
          std::allocator<char>::~allocator(&local_769);
          abort();
        }
      }
    }
    std::__cxx11::stringstream::stringstream(local_428);
    std::operator<<(local_418,"Eval method called on inactive cell");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,
               "extendedLoadVectorProvider_->isActive(cell) && extendedStiffnessMatrixProvider_->isActive(cell) && gramianProvider_->isActive(cell)"
               ,&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,&local_471);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_448,&local_470,0x8d,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"false",&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
               ,&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,"",
               (allocator<char> *)
               ((long)&extendedLoadVector.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows + 7));
    lf::base::AssertionFailed(&local_4b8,&local_4e0,0x8d,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extendedLoadVector.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows + 7));
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    abort();
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"nullptr error for some provider");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,
             "extendedLoadVectorProvider_ != nullptr && extendedStiffnessMatrixProvider_ != nullptr && gramianProvider_ != nullptr"
             ,&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x89,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../dpg_element_vector_provider.h"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  lf::base::AssertionFailed(&local_248,&local_270,0x89,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

typename DpgElementVectorProvider<SCALAR>::ElemVec
DpgElementVectorProvider<SCALAR>::Eval(const lf::mesh::Entity& cell) {
  // check for nullptrs
  LF_ASSERT_MSG(extendedLoadVectorProvider_ != nullptr &&
                    extendedStiffnessMatrixProvider_ != nullptr &&
                    gramianProvider_ != nullptr,
                "nullptr error for some provider");
  LF_ASSERT_MSG(extendedLoadVectorProvider_->isActive(cell) &&
                    extendedStiffnessMatrixProvider_->isActive(cell) &&
                    gramianProvider_->isActive(cell),
                "Eval method called on inactive cell");

  // evaluate extended element vector l, extended stiffness matrix B and local
  // Gramian G.
  ElemVec extendedLoadVector = extendedLoadVectorProvider_->Eval(cell);
  ElemMat extendedStiffnessMatrix =
      extendedStiffnessMatrixProvider_->Eval(cell);
  ElemMat gramian = gramianProvider_->Eval(cell);

  // perform some size checks.
  LF_ASSERT_MSG(gramian.rows() == gramian.cols(),
                "non quadratic gramian of size ("
                    << gramian.rows() << ", " << gramian.cols() << ") on cell "
                    << cell << "\n");

  // evaluate element vector B^T G^-1 l
  return extendedStiffnessMatrix.transpose() *
         gramian.ldlt().solve(extendedLoadVector);
}